

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_setup_key_shares(SSL_HANDSHAKE *hs,uint16_t override_group_id)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  uint16_t value;
  int iVar4;
  uint uVar5;
  cbb_st *pcVar6;
  pointer psVar7;
  unsigned_short *puVar8;
  size_t sVar9;
  pointer pSVar10;
  Span<const_unsigned_short> SVar11;
  unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> local_c8;
  unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> local_c0;
  undefined1 local_b8 [8];
  CBB key_exchange;
  size_t i;
  Span<const_unsigned_short> groups;
  uint16_t second_group_id;
  uint16_t group_id;
  undefined1 local_58 [8];
  ScopedCBB cbb;
  SSL *ssl;
  uint16_t override_group_id_local;
  SSL_HANDSHAKE *hs_local;
  
  cbb.ctx_.u._24_8_ = hs->ssl;
  std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset(hs->key_shares,(pointer)0x0);
  std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
            (hs->key_shares + 1,(pointer)0x0);
  Array<unsigned_char>::Reset(&hs->key_share_bytes);
  if ((hs->max_version < 0x304) ||
     (bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->pake_prover), bVar2)) {
    return true;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
  pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
  iVar4 = CBB_init(pcVar6,0x40);
  if (iVar4 == 0) {
    hs_local._7_1_ = false;
    goto LAB_00163e51;
  }
  if ((override_group_id == 0) &&
     (psVar7 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                          (cbb.ctx_.u._24_8_ + 0x68)),
     (*(ushort *)&psVar7->field_0x288 >> 5 & 1) != 0)) {
    pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
    value = ssl_get_grease_value(hs,ssl_grease_group);
    iVar4 = CBB_add_u16(pcVar6,value);
    if (iVar4 != 0) {
      pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
      iVar4 = CBB_add_u16(pcVar6,1);
      if (iVar4 != 0) {
        pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
        iVar4 = CBB_add_u8(pcVar6,'\0');
        if (iVar4 != 0) goto LAB_00163a0e;
      }
    }
    hs_local._7_1_ = false;
    goto LAB_00163e51;
  }
LAB_00163a0e:
  groups.size_._4_2_ = 0;
  groups.size_._6_2_ = override_group_id;
  if (override_group_id == 0) {
    SVar11 = tls1_get_grouplist(hs);
    groups.data_ = (unsigned_short *)SVar11.size_;
    i = (size_t)SVar11.data_;
    bVar2 = Span<const_unsigned_short>::empty((Span<const_unsigned_short> *)&i);
    if (bVar2) {
      ERR_put_error(0x10,0,0x109,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x8b7);
      hs_local._7_1_ = false;
      goto LAB_00163e51;
    }
    puVar8 = Span<const_unsigned_short>::operator[]((Span<const_unsigned_short> *)&i,0);
    groups.size_._6_2_ = *puVar8;
    for (key_exchange.u._24_8_ = 1; uVar1 = key_exchange.u._24_8_,
        sVar9 = Span<const_unsigned_short>::size((Span<const_unsigned_short> *)&i),
        (ulong)uVar1 < sVar9 && groups.size_._4_2_ == 0;
        key_exchange.u._24_8_ = key_exchange.u._24_8_ + 1) {
      bVar2 = is_post_quantum_group(groups.size_._6_2_);
      puVar8 = Span<const_unsigned_short>::operator[]
                         ((Span<const_unsigned_short> *)&i,key_exchange.u._24_8_);
      bVar3 = is_post_quantum_group(*puVar8);
      if (bVar2 != bVar3) {
        puVar8 = Span<const_unsigned_short>::operator[]
                           ((Span<const_unsigned_short> *)&i,key_exchange.u._24_8_);
        groups.size_._4_2_ = *puVar8;
        if (groups.size_._4_2_ == groups.size_._6_2_) {
          __assert_fail("second_group_id != group_id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x8c2,"bool bssl::ssl_setup_key_shares(SSL_HANDSHAKE *, uint16_t)");
        }
      }
    }
  }
  SSLKeyShare::Create((SSLKeyShare *)&local_c0,groups.size_._6_2_);
  std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::operator=(hs->key_shares,&local_c0);
  std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr(&local_c0);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)hs->key_shares);
  if (bVar2) {
    pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
    iVar4 = CBB_add_u16(pcVar6,groups.size_._6_2_);
    if (iVar4 != 0) {
      pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
      iVar4 = CBB_add_u16_length_prefixed(pcVar6,(CBB *)local_b8);
      if (iVar4 != 0) {
        pSVar10 = std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::operator->
                            (hs->key_shares);
        uVar5 = (*pSVar10->_vptr_SSLKeyShare[3])(pSVar10,local_b8);
        if ((uVar5 & 1) != 0) {
          if (groups.size_._4_2_ == 0) {
LAB_00163e0e:
            pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
            hs_local._7_1_ = CBBFinishArray(pcVar6,&hs->key_share_bytes);
          }
          else {
            SSLKeyShare::Create((SSLKeyShare *)&local_c8,groups.size_._4_2_);
            std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::operator=
                      (hs->key_shares + 1,&local_c8);
            std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr(&local_c8);
            bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(hs->key_shares + 1));
            if (bVar2) {
              pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58)
              ;
              iVar4 = CBB_add_u16(pcVar6,groups.size_._4_2_);
              if (iVar4 != 0) {
                pcVar6 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    local_58);
                iVar4 = CBB_add_u16_length_prefixed(pcVar6,(CBB *)local_b8);
                if (iVar4 != 0) {
                  pSVar10 = std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::operator->
                                      (hs->key_shares + 1);
                  uVar5 = (*pSVar10->_vptr_SSLKeyShare[3])(pSVar10,local_b8);
                  if ((uVar5 & 1) != 0) goto LAB_00163e0e;
                }
              }
            }
            hs_local._7_1_ = false;
          }
          goto LAB_00163e51;
        }
      }
    }
  }
  hs_local._7_1_ = false;
LAB_00163e51:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_58);
  return hs_local._7_1_;
}

Assistant:

bool ssl_setup_key_shares(SSL_HANDSHAKE *hs, uint16_t override_group_id) {
  SSL *const ssl = hs->ssl;
  hs->key_shares[0].reset();
  hs->key_shares[1].reset();
  hs->key_share_bytes.Reset();

  // If offering a PAKE, do not set up key shares. We do not currently support
  // clients offering both PAKE and non-PAKE modes, including resumption.
  if (hs->max_version < TLS1_3_VERSION || hs->pake_prover) {
    return true;
  }

  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 64)) {
    return false;
  }

  if (override_group_id == 0 && ssl->ctx->grease_enabled) {
    // Add a fake group. See RFC 8701.
    if (!CBB_add_u16(cbb.get(), ssl_get_grease_value(hs, ssl_grease_group)) ||
        !CBB_add_u16(cbb.get(), 1 /* length */) ||
        !CBB_add_u8(cbb.get(), 0 /* one byte key share */)) {
      return false;
    }
  }

  uint16_t group_id = override_group_id;
  uint16_t second_group_id = 0;
  if (override_group_id == 0) {
    // Predict the most preferred group.
    Span<const uint16_t> groups = tls1_get_grouplist(hs);
    if (groups.empty()) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_NO_GROUPS_SPECIFIED);
      return false;
    }

    group_id = groups[0];

    // We'll try to include one post-quantum and one classical initial key
    // share.
    for (size_t i = 1; i < groups.size() && second_group_id == 0; i++) {
      if (is_post_quantum_group(group_id) != is_post_quantum_group(groups[i])) {
        second_group_id = groups[i];
        assert(second_group_id != group_id);
      }
    }
  }

  CBB key_exchange;
  hs->key_shares[0] = SSLKeyShare::Create(group_id);
  if (!hs->key_shares[0] ||  //
      !CBB_add_u16(cbb.get(), group_id) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &key_exchange) ||
      !hs->key_shares[0]->Generate(&key_exchange)) {
    return false;
  }

  if (second_group_id != 0) {
    hs->key_shares[1] = SSLKeyShare::Create(second_group_id);
    if (!hs->key_shares[1] ||  //
        !CBB_add_u16(cbb.get(), second_group_id) ||
        !CBB_add_u16_length_prefixed(cbb.get(), &key_exchange) ||
        !hs->key_shares[1]->Generate(&key_exchange)) {
      return false;
    }
  }

  return CBBFinishArray(cbb.get(), &hs->key_share_bytes);
}